

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5UnicodeAddExceptions(Unicode61Tokenizer *p,char *z,int bTokenChars)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  int *piVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  u32 iCode;
  byte *pbVar11;
  byte *pbVar12;
  
  sVar4 = strlen(z);
  uVar2 = (uint)sVar4;
  if ((int)uVar2 < 1) {
LAB_001c2c76:
    iVar3 = 0;
  }
  else {
    piVar5 = (int *)sqlite3_realloc64(p->aiException,((long)(int)uVar2 + (long)p->nException) * 4);
    if (piVar5 != (int *)0x0) {
      uVar8 = p->nException;
      pbVar12 = (byte *)(z + (uVar2 & 0x7fffffff));
      do {
        uVar6 = 0;
        if (0 < (int)uVar8) {
          uVar6 = (ulong)uVar8;
        }
LAB_001c2b48:
        do {
          if (pbVar12 <= z) {
            p->aiException = piVar5;
            p->nException = uVar8;
            goto LAB_001c2c76;
          }
          bVar1 = *z;
          uVar2 = (uint)bVar1;
          pbVar11 = (byte *)z + 1;
          z = (char *)pbVar11;
          if (bVar1 < 0xc0) {
LAB_001c2bbf:
            iCode = uVar2;
            if (uVar2 < 0x80) {
              p->aTokenChar[uVar2] = (uchar)bTokenChars;
              goto LAB_001c2b48;
            }
          }
          else {
            uVar2 = (uint)""[bVar1 - 0xc0];
            for (; (z = (char *)pbVar12, pbVar11 != pbVar12 &&
                   (z = (char *)pbVar11, (*pbVar11 & 0xffffffc0) == 0x80)); pbVar11 = pbVar11 + 1) {
              uVar2 = uVar2 << 6 | *pbVar11 & 0x3f;
            }
            iCode = 0xfffd;
            if ((((uVar2 & 0xfffffffe) != 0xfffe) && (0x7f < uVar2)) &&
               ((uVar2 & 0xfffff800) != 0xd800)) goto LAB_001c2bbf;
          }
          uVar2 = sqlite3Fts5UnicodeCategory(iCode);
        } while (((uint)p->aCategory[uVar2] == bTokenChars) ||
                (iVar3 = sqlite3Fts5UnicodeIsdiacritic(iCode), iVar3 != 0));
        uVar7 = 0;
        if (0 < (int)uVar8) {
          uVar7 = (ulong)uVar8;
        }
        for (uVar9 = 0; uVar10 = uVar7, uVar6 != uVar9; uVar9 = uVar9 + 1) {
          if (iCode < (uint)piVar5[uVar9]) {
            uVar7 = uVar9 & 0xffffffff;
            uVar10 = uVar9;
            break;
          }
        }
        memmove(piVar5 + uVar10 + 1,piVar5 + uVar10,(long)(int)(uVar8 - (int)uVar7) << 2);
        piVar5[uVar10] = iCode;
        uVar8 = uVar8 + 1;
      } while( true );
    }
    iVar3 = 7;
  }
  return iVar3;
}

Assistant:

static int fts5UnicodeAddExceptions(
  Unicode61Tokenizer *p,          /* Tokenizer object */
  const char *z,                  /* Characters to treat as exceptions */
  int bTokenChars                 /* 1 for 'tokenchars', 0 for 'separators' */
){
  int rc = SQLITE_OK;
  int n = (int)strlen(z);
  int *aNew;

  if( n>0 ){
    aNew = (int*)sqlite3_realloc64(p->aiException,
                                   (n+p->nException)*sizeof(int));
    if( aNew ){
      int nNew = p->nException;
      const unsigned char *zCsr = (const unsigned char*)z;
      const unsigned char *zTerm = (const unsigned char*)&z[n];
      while( zCsr<zTerm ){
        u32 iCode;
        int bToken;
        READ_UTF8(zCsr, zTerm, iCode);
        if( iCode<128 ){
          p->aTokenChar[iCode] = (unsigned char)bTokenChars;
        }else{
          bToken = p->aCategory[sqlite3Fts5UnicodeCategory(iCode)];
          assert( (bToken==0 || bToken==1) ); 
          assert( (bTokenChars==0 || bTokenChars==1) );
          if( bToken!=bTokenChars && sqlite3Fts5UnicodeIsdiacritic(iCode)==0 ){
            int i;
            for(i=0; i<nNew; i++){
              if( (u32)aNew[i]>iCode ) break;
            }
            memmove(&aNew[i+1], &aNew[i], (nNew-i)*sizeof(int));
            aNew[i] = iCode;
            nNew++;
          }
        }
      }
      p->aiException = aNew;
      p->nException = nNew;
    }else{
      rc = SQLITE_NOMEM;
    }
  }

  return rc;
}